

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

void shape_lore_append_misc_flags(textblock *tb,player_shape *s)

{
  _Bool _Var1;
  int iVar2;
  obj_property *poVar3;
  char *pcVar4;
  obj_property *prop;
  player_ability *ability;
  wchar_t i;
  wchar_t n;
  player_shape *s_local;
  textblock *tb_local;
  
  ability._4_4_ = 0;
  for (ability._0_4_ = L'\x01'; (wchar_t)ability < L'-'; ability._0_4_ = (wchar_t)ability + L'\x01')
  {
    poVar3 = lookup_obj_property(L'\x03',(wchar_t)ability);
    if ((((poVar3->subtype == L'\x03') || (poVar3->subtype == L'\x05')) ||
        (poVar3->subtype == L'\x06')) &&
       (_Var1 = flag_has_dbg(s->flags,6,poVar3->index,"s->flags","prop->index"), _Var1)) {
      pcVar4 = "";
      if (0 < ability._4_4_) {
        pcVar4 = "  ";
      }
      textblock_append(tb,"%s%s.",pcVar4,poVar3->desc);
      ability._4_4_ = ability._4_4_ + 1;
    }
  }
  for (prop = (obj_property *)player_abilities; prop != (obj_property *)0x0; prop = prop->next) {
    iVar2 = strcmp(*(char **)&prop->id_type,"player");
    if ((iVar2 == 0) &&
       (_Var1 = flag_has_dbg(s->pflags,10,(uint)(ushort)prop->type,"s->pflags","ability->index"),
       _Var1)) {
      pcVar4 = "";
      if (0 < ability._4_4_) {
        pcVar4 = "  ";
      }
      textblock_append(tb,"%s%s",pcVar4,*(undefined8 *)prop->type_mult);
      ability._4_4_ = ability._4_4_ + 1;
    }
  }
  if (0 < ability._4_4_) {
    textblock_append(tb,"\n");
  }
  return;
}

Assistant:

static void shape_lore_append_misc_flags(textblock *tb,
	const struct player_shape *s)
{
	int n = 0;
	int i;
	struct player_ability *ability;

	for (i = 1; i < OF_MAX; ++i) {
		struct obj_property *prop =
			lookup_obj_property(OBJ_PROPERTY_FLAG, i);

		if ((prop->subtype == OFT_MISC || prop->subtype == OFT_WEAPON ||
			prop->subtype == OFT_BAD) &&
			of_has(s->flags, prop->index)) {
			textblock_append(tb, "%s%s.", (n > 0) ? "  " : "",
				prop->desc);
			++n;
		}
	}

	for (ability = player_abilities; ability; ability = ability->next) {
		if (streq(ability->type, "player") &&
			pf_has(s->pflags, ability->index)) {
			textblock_append(tb, "%s%s", (n > 0) ? "  " : "",
				ability->desc);
			++n;
		}
	}

	if (n > 0) {
		textblock_append(tb, "\n");
	}
}